

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O0

bool SignalsOptInRBF(CTransaction *tx)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
  *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  reference in_stack_ffffffffffffffc8;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  do {
    bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_ffffffffffffffc8,
                       (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_19 = false;
LAB_00f9d1fe:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_19;
      }
      __stack_chk_fail();
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
         operator*(in_stack_ffffffffffffffb8);
    if (in_stack_ffffffffffffffc8->nSequence < 0xfffffffe) {
      local_19 = true;
      goto LAB_00f9d1fe;
    }
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++(in_stack_ffffffffffffffb8);
  } while( true );
}

Assistant:

bool SignalsOptInRBF(const CTransaction &tx)
{
    for (const CTxIn &txin : tx.vin) {
        if (txin.nSequence <= MAX_BIP125_RBF_SEQUENCE) {
            return true;
        }
    }
    return false;
}